

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O1

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareDestinationTextureAndFramebuffer
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  uint uVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  undefined4 uVar7;
  FunctionalTest *this_00;
  undefined4 *puVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  long lVar5;
  
  this_00 = (FunctionalTest *)((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*(this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = getDestinationFormatForChannel(this_00,descriptor);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_framebuffer);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x186);
  (**(code **)(lVar5 + 0x78))(0x8d40,this->m_framebuffer);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x189);
  (**(code **)(lVar5 + 0x6f8))(1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x18d);
  (**(code **)(lVar5 + 0xb8))(target,this->m_destination_texture);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,400);
  if (target == 0x9100) {
    (**(code **)(lVar5 + 0x1318))(0x9100,this->m_max_samples + -1,descriptor.internal_format,1,1,1);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1b4);
    (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0x9100,this->m_destination_texture,0);
    iVar2 = 0x1b7;
  }
  else if (target == 0xde1) {
    bVar9 = descriptor.expected_red_type != 0x1404;
    bVar10 = descriptor.expected_green_type != 0x1404;
    bVar11 = descriptor.expected_blue_type != 0x1404;
    bVar12 = descriptor.expected_alpha_type != 0x1404;
    puVar8 = &s_destination_texture_data_f;
    if ((!bVar12 || !bVar11) || (!bVar10 || !bVar9)) {
      puVar8 = &s_destination_texture_data_i;
    }
    uVar7 = 0x1903;
    if ((!bVar12 || !bVar11) || (!bVar10 || !bVar9)) {
      uVar7 = 0x8d94;
    }
    uVar1 = (uint)((bVar12 && bVar11) && (bVar10 && bVar9)) * 2 | 0x1404;
    if ((descriptor.expected_alpha_type == 0x1405 || descriptor.expected_blue_type == 0x1405) ||
        (descriptor.expected_green_type == 0x1405 || descriptor.expected_red_type == 0x1405)) {
      uVar1 = 0x1405;
      uVar7 = 0x8d94;
    }
    puVar6 = &s_destination_texture_data_ui;
    if ((descriptor.expected_alpha_type != 0x1405 && descriptor.expected_blue_type != 0x1405) &&
        (descriptor.expected_green_type != 0x1405 && descriptor.expected_red_type != 0x1405)) {
      puVar6 = puVar8;
    }
    (**(code **)(lVar5 + 0x1310))(0xde1,0,GVar3,1,1,0,uVar7,uVar1,puVar6);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1a9);
    (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_destination_texture,0);
    iVar2 = 0x1ac;
  }
  else {
    (**(code **)(lVar5 + 0x1328))
              (target,this->m_max_samples + -1,descriptor.internal_format,1,1,1,1);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1bd);
    (**(code **)(lVar5 + 0x6b8))(0x8d40,0x8ce0,this->m_destination_texture,0,0);
    iVar2 = 0x1c0;
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glFramebufferTexture2D have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,iVar2);
  iVar2 = (**(code **)(lVar5 + 0x170))(0x8d40);
  if (iVar2 != 0x8cd5) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  (**(code **)(lVar5 + 0x1a00))(0,0,1,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glViewport call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x1cc);
  return;
}

Assistant:

void FunctionalTest::prepareDestinationTextureAndFramebuffer(TextureInternalFormatDescriptor descriptor,
															 glw::GLenum					 target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get internal format. */
	glw::GLenum internal_format = getDestinationFormatForChannel(descriptor);

	/* Create framebuffer object. */
	gl.genFramebuffers(1, &m_framebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Create framebuffer's destination texture. */
	gl.genTextures(1, &m_destination_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	gl.bindTexture(target, m_destination_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* Allocate texture storage and upload data for test rendering. */
	if (target == GL_TEXTURE_2D)
	{
		glw::GLenum  destination_format = GL_RED;
		glw::GLenum  destination_type   = GL_FLOAT;
		glw::GLvoid* destination_data   = (glw::GLvoid*)s_destination_texture_data_f;

		if (isIntegerSignedType(descriptor))
		{
			destination_format = GL_RED_INTEGER;
			destination_type   = GL_INT;
			destination_data   = (glw::GLvoid*)s_destination_texture_data_i;
		}

		if (isIntegerUnsignedType(descriptor))
		{
			destination_format = GL_RED_INTEGER;
			destination_type   = GL_UNSIGNED_INT;
			destination_data   = (glw::GLvoid*)s_destination_texture_data_ui;
		}

		gl.texImage2D(target, 0, internal_format, s_source_texture_size, s_source_texture_size, 0, destination_format,
					  destination_type, destination_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_destination_texture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D have failed");
	}
	else /* Allocate texture storage for uploading datat for multisampled targets (upload must be done via shader). */
	{
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
		{
			gl.texImage2DMultisample(target, m_max_samples - 1, descriptor.internal_format, s_source_texture_size,
									 s_source_texture_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, m_destination_texture, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D have failed");
		}
		else
		{
			gl.texImage3DMultisample(target, m_max_samples - 1, descriptor.internal_format, s_source_texture_size,
									 s_source_texture_size, s_source_texture_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

			gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_destination_texture, 0, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D have failed");
		}
	}

	/* Check framebuffer completness. */
	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	/* Setup viewport. */
	gl.viewport(0, 0, s_source_texture_size, s_source_texture_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}